

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int getNodeSize(sqlite3 *db,Rtree *pRtree,int isCreate,char **pzErr)

{
  int iVar1;
  char *zSql;
  char *pcVar2;
  int iVar3;
  long in_FS_OFFSET;
  int iPageSize;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (isCreate == 0) {
    iVar1 = 0;
    zSql = sqlite3_mprintf("SELECT length(data) FROM \'%q\'.\'%q_node\' WHERE nodeno = 1",
                           pRtree->zDb,pRtree->zName);
    iVar3 = getIntFromStmt(db,zSql,&pRtree->iNodeSize);
    if (iVar3 == 0) {
      if (pRtree->iNodeSize < 0x1c0) {
        pcVar2 = sqlite3_mprintf("undersize RTree blobs in \"%q_node\"",pRtree->zName);
        *pzErr = pcVar2;
        iVar1 = 0x10b;
      }
    }
    else {
      pcVar2 = sqlite3_errmsg(db);
      pcVar2 = sqlite3_mprintf("%s",pcVar2);
      *pzErr = pcVar2;
      iVar1 = iVar3;
    }
  }
  else {
    local_3c = 0;
    zSql = sqlite3_mprintf("PRAGMA %Q.page_size",pRtree->zDb);
    iVar1 = getIntFromStmt(db,zSql,&local_3c);
    if (iVar1 == 0) {
      iVar3 = (uint)pRtree->nBytesPerCell * 0x33 + 4;
      if (local_3c + -0x40 <= iVar3) {
        iVar3 = local_3c + -0x40;
      }
      pRtree->iNodeSize = iVar3;
    }
    else {
      pcVar2 = sqlite3_errmsg(db);
      pcVar2 = sqlite3_mprintf("%s",pcVar2);
      *pzErr = pcVar2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    sqlite3_free(zSql);
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int getNodeSize(
  sqlite3 *db,                    /* Database handle */
  Rtree *pRtree,                  /* Rtree handle */
  int isCreate,                   /* True for xCreate, false for xConnect */
  char **pzErr                    /* OUT: Error message, if any */
){
  int rc;
  char *zSql;
  if( isCreate ){
    int iPageSize = 0;
    zSql = sqlite3_mprintf("PRAGMA %Q.page_size", pRtree->zDb);
    rc = getIntFromStmt(db, zSql, &iPageSize);
    if( rc==SQLITE_OK ){
      pRtree->iNodeSize = iPageSize-64;
      if( (4+pRtree->nBytesPerCell*RTREE_MAXCELLS)<pRtree->iNodeSize ){
        pRtree->iNodeSize = 4+pRtree->nBytesPerCell*RTREE_MAXCELLS;
      }
    }else{
      *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
    }
  }else{
    zSql = sqlite3_mprintf(
        "SELECT length(data) FROM '%q'.'%q_node' WHERE nodeno = 1",
        pRtree->zDb, pRtree->zName
    );
    rc = getIntFromStmt(db, zSql, &pRtree->iNodeSize);
    if( rc!=SQLITE_OK ){
      *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
    }else if( pRtree->iNodeSize<(512-64) ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
      *pzErr = sqlite3_mprintf("undersize RTree blobs in \"%q_node\"",
                               pRtree->zName);
    }
  }

  sqlite3_free(zSql);
  return rc;
}